

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint * create_return_by_value_constraint(intptr_t value_to_return,size_t size)

{
  void *__dest;
  Constraint *pCVar1;
  
  __dest = malloc(size);
  memcpy(__dest,(void *)value_to_return,size);
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  pCVar1->type = CGREEN_RETURN_BY_VALUE_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = test_true;
  pCVar1->name = "return by value";
  make_cgreen_by_value(&pCVar1->expected_value,__dest,size);
  pCVar1->destroy = destroy_by_value_constraint;
  return pCVar1;
}

Assistant:

Constraint *create_return_by_value_constraint(intptr_t value_to_return, size_t size) {
    intptr_t actual_return = (intptr_t) malloc(size);
    memcpy((void*)actual_return, (void*)value_to_return, size);
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_RETURN_BY_VALUE_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &test_true;
    constraint->name = "return by value";
    constraint->expected_value = make_cgreen_by_value((void*)actual_return, size);
    constraint->destroy = &destroy_by_value_constraint;

    return constraint;
}